

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

unique_ptr<Parser,_std::default_delete<Parser>_> DefaultParser(void)

{
  pointer pPVar1;
  __uniq_ptr_data<Parser,_std::default_delete<Parser>,_true,_true> in_RDI;
  __single_object *p;
  
  std::make_unique<Parser>();
  pPVar1 = std::unique_ptr<Parser,_std::default_delete<Parser>_>::operator->
                     ((unique_ptr<Parser,_std::default_delete<Parser>_> *)
                      in_RDI.super___uniq_ptr_impl<Parser,_std::default_delete<Parser>_>._M_t.
                      super__Tuple_impl<0UL,_Parser_*,_std::default_delete<Parser>_>.
                      super__Head_base<0UL,_Parser_*,_false>._M_head_impl);
  Parser::Register<AddOp>(pPVar1);
  pPVar1 = std::unique_ptr<Parser,_std::default_delete<Parser>_>::operator->
                     ((unique_ptr<Parser,_std::default_delete<Parser>_> *)
                      in_RDI.super___uniq_ptr_impl<Parser,_std::default_delete<Parser>_>._M_t.
                      super__Tuple_impl<0UL,_Parser_*,_std::default_delete<Parser>_>.
                      super__Head_base<0UL,_Parser_*,_false>._M_head_impl);
  Parser::Register<MulOp>(pPVar1);
  pPVar1 = std::unique_ptr<Parser,_std::default_delete<Parser>_>::operator->
                     ((unique_ptr<Parser,_std::default_delete<Parser>_> *)
                      in_RDI.super___uniq_ptr_impl<Parser,_std::default_delete<Parser>_>._M_t.
                      super__Tuple_impl<0UL,_Parser_*,_std::default_delete<Parser>_>.
                      super__Head_base<0UL,_Parser_*,_false>._M_head_impl);
  Parser::Register<SubOp>(pPVar1);
  pPVar1 = std::unique_ptr<Parser,_std::default_delete<Parser>_>::operator->
                     ((unique_ptr<Parser,_std::default_delete<Parser>_> *)
                      in_RDI.super___uniq_ptr_impl<Parser,_std::default_delete<Parser>_>._M_t.
                      super__Tuple_impl<0UL,_Parser_*,_std::default_delete<Parser>_>.
                      super__Head_base<0UL,_Parser_*,_false>._M_head_impl);
  Parser::Register<DivOp>(pPVar1);
  return (__uniq_ptr_data<Parser,_std::default_delete<Parser>,_true,_true>)
         (tuple<Parser_*,_std::default_delete<Parser>_>)
         in_RDI.super___uniq_ptr_impl<Parser,_std::default_delete<Parser>_>._M_t.
         super__Tuple_impl<0UL,_Parser_*,_std::default_delete<Parser>_>.
         super__Head_base<0UL,_Parser_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<Parser> DefaultParser() {
  auto p = std::make_unique<Parser>();
  p->Register<AddOp>();
  p->Register<MulOp>();
  p->Register<SubOp>();
  p->Register<DivOp>();
  return p;
}